

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O2

int envy_bios_parse_power_boost(envy_bios *bios)

{
  uint8_t uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  envy_bios_power_boost_entry *peVar8;
  envy_bios_power_boost_subentry *peVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  uint8_t *res;
  ulong uVar15;
  uint16_t tmp;
  uint local_4c;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  uVar3 = (bios->power).boost.offset;
  iVar10 = -0x16;
  if (uVar3 != 0) {
    bios_u8(bios,uVar3,&(bios->power).boost.version);
    uVar1 = (bios->power).boost.version;
    if (uVar1 == '\x11') {
      uVar3 = bios_u8(bios,(bios->power).boost.offset + 1,&(bios->power).boost.hlen);
      uVar4 = bios_u8(bios,(bios->power).boost.offset + 2,&(bios->power).boost.rlen);
      uVar6 = bios_u8(bios,(bios->power).boost.offset + 3,&(bios->power).boost.ssz);
      uVar7 = bios_u8(bios,(bios->power).boost.offset + 4,&(bios->power).boost.snr);
      uVar5 = bios_u8(bios,(bios->power).boost.offset + 5,&(bios->power).boost.entriesnum);
      uVar5 = uVar5 | uVar7 | uVar6 | uVar4 | uVar3;
    }
    else {
      if (uVar1 != '\x10') {
        fprintf(_stderr,"Unknown BOOST table version 0x%x\n");
        return -0x16;
      }
      uVar3 = bios_u8(bios,(bios->power).boost.offset + 1,&(bios->power).boost.hlen);
      uVar4 = bios_u8(bios,(bios->power).boost.offset + 2,&(bios->power).boost.rlen);
      uVar5 = bios_u8(bios,(bios->power).boost.offset + 3,&(bios->power).boost.entriesnum);
      uVar5 = uVar5 | uVar4 | uVar3;
      (bios->power).boost.snr = '\0';
      (bios->power).boost.ssz = '\0';
    }
    (bios->power).boost.valid = uVar5 == 0;
    uVar11 = (ulong)(bios->power).boost.entriesnum;
    peVar8 = (envy_bios_power_boost_entry *)malloc(uVar11 * 0x18);
    (bios->power).boost.entries = peVar8;
    uVar15 = 0;
    while (uVar15 < uVar11) {
      iVar14 = (uint)(bios->power).boost.hlen + (bios->power).boost.offset;
      iVar10 = (int)uVar15 *
               ((uint)(bios->power).boost.ssz * (uint)(bios->power).boost.snr +
               (uint)(bios->power).boost.rlen);
      uVar3 = iVar14 + iVar10;
      bios_u16(bios,uVar3,&tmp);
      local_48 = uVar15;
      bios_u16(bios,iVar10 + iVar14 + 2,&(bios->power).boost.entries[uVar15].min);
      bios_u16(bios,iVar10 + iVar14 + 4,&(bios->power).boost.entries[uVar15].max);
      peVar8 = (bios->power).boost.entries;
      peVar8[uVar15].offset = uVar3;
      peVar8[uVar15].pstate = (byte)(tmp >> 5) & 0xf;
      uVar11 = (ulong)(bios->power).boost.snr;
      local_4c = uVar3;
      peVar9 = (envy_bios_power_boost_subentry *)malloc(uVar11 * 0xc);
      peVar8[uVar15].entries = peVar9;
      lVar13 = 4;
      uVar12 = 0;
      local_40 = uVar15 * 0x18;
      while (uVar12 < uVar11) {
        lVar2 = *(long *)((long)&((bios->power).boost.entries)->entries + local_40);
        iVar14 = (bios->power).boost.rlen + local_4c;
        iVar10 = (uint)(bios->power).boost.ssz * (int)uVar12;
        res = (uint8_t *)(lVar13 + 1 + lVar2);
        *(int *)(res + -5) = iVar14 + iVar10;
        local_38 = uVar12;
        bios_u8(bios,iVar14 + iVar10,(uint8_t *)(lVar2 + lVar13));
        bios_u8(bios,iVar10 + iVar14 + 1,res);
        bios_u16(bios,iVar10 + iVar14 + 2,(uint16_t *)(lVar13 + 2 + lVar2));
        bios_u16(bios,iVar10 + iVar14 + 4,(uint16_t *)(lVar13 + 4 + lVar2));
        uVar11 = (ulong)(bios->power).boost.snr;
        lVar13 = lVar13 + 0xc;
        uVar12 = local_38 + 1;
      }
      uVar11 = (ulong)(bios->power).boost.entriesnum;
      uVar15 = local_48 + 1;
    }
    iVar10 = 0;
  }
  return iVar10;
}

Assistant:

int envy_bios_parse_power_boost(struct envy_bios *bios) {
	struct envy_bios_power_boost *boost = &bios->power.boost;
	int i, j, err = 0;

	if (!boost->offset)
		return -EINVAL;

	bios_u8(bios, boost->offset + 0x0, &boost->version);
	switch(boost->version) {
	case 0x10:
		err |= bios_u8(bios, boost->offset + 0x1, &boost->hlen);
		err |= bios_u8(bios, boost->offset + 0x2, &boost->rlen);
		err |= bios_u8(bios, boost->offset + 0x3, &boost->entriesnum);
		boost->ssz = 0;
		boost->snr = 0;
		boost->valid = !err;
		break;
	case 0x11:
		err |= bios_u8(bios, boost->offset + 0x1, &boost->hlen);
		err |= bios_u8(bios, boost->offset + 0x2, &boost->rlen);
		err |= bios_u8(bios, boost->offset + 0x3, &boost->ssz);
		err |= bios_u8(bios, boost->offset + 0x4, &boost->snr);
		err |= bios_u8(bios, boost->offset + 0x5, &boost->entriesnum);
		boost->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown BOOST table version 0x%x\n", boost->version);
		return -EINVAL;
	};

	boost->entries = malloc(boost->entriesnum * sizeof(struct envy_bios_power_boost_entry));

	for (i = 0; i < boost->entriesnum; i++) {
		uint32_t data = boost->offset + boost->hlen + i * (boost->rlen + (boost->snr * boost->ssz));

		uint16_t tmp;
		err |= bios_u16(bios, data + 0x0, &tmp);
		err |= bios_u16(bios, data + 0x2, &boost->entries[i].min);
		err |= bios_u16(bios, data + 0x4, &boost->entries[i].max);

		boost->entries[i].offset = data;
		boost->entries[i].pstate = (tmp & 0x01e0) >> 5;

		boost->entries[i].entries = malloc(boost->snr * sizeof(struct envy_bios_power_boost_subentry));

		for (j = 0; j < boost->snr; j++) {
			struct envy_bios_power_boost_subentry *sub = &boost->entries[i].entries[j];
			uint32_t sdata = data + boost->rlen + j * boost->ssz;

			sub->offset = sdata;
			bios_u8(bios, sdata + 0x0, &sub->domain);
			bios_u8(bios, sdata + 0x1, &sub->percent);
			bios_u16(bios, sdata + 0x2, &sub->min);
			bios_u16(bios, sdata + 0x4, &sub->max);
		}
	}

	return 0;
}